

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::RequiredFieldsByteSizeFallback
          (UninterpretedOption_NamePart *this)

{
  uint uVar1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) == 0) {
    lVar4 = 0;
  }
  else {
    sVar2 = ((this->name_part_).ptr_)->_M_string_length;
    uVar5 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar4 = sVar2 + (iVar3 * 9 + 0x49U >> 6) + 1;
  }
  return (ulong)(uVar1 & 2) + lVar4;
}

Assistant:

inline bool UninterpretedOption_NamePart::_internal_has_name_part() const {
  bool value = (_has_bits_[0] & 0x00000001u) != 0;
  return value;
}